

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_fma::create_pipeline(DeformableConv2D_x86_fma *this,Option *opt)

{
  Mat *this_00;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  long *plVar9;
  ulong uVar10;
  Layer *pLVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  int iVar14;
  undefined4 *puVar15;
  ulong uVar16;
  long lVar17;
  undefined4 *puVar18;
  long lVar19;
  char cVar20;
  ParamDict permute_pd;
  ParamDict pd;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 auStack_15c [2];
  char local_149;
  undefined1 local_148 [16];
  ParamDict local_138;
  Mat local_128;
  void *local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  long *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  void *local_38;
  
  p_Var1 = this->_vptr_DeformableConv2D_x86_fma[-3];
  uVar10 = (long)*(int *)(&this->field_0x100 + (long)p_Var1) /
           (long)(*(int *)(&this->field_0xd8 + (long)p_Var1) *
                  *(int *)(&this->field_0xd0 + (long)p_Var1) *
                 *(int *)(&this->field_0xd4 + (long)p_Var1));
  p_Var1 = this->_vptr_DeformableConv2D_x86_fma[-3];
  iVar14 = (int)uVar10;
  uStack_160 = 0x54454f;
  Mat::reshape(&local_98,(Mat *)(&this->field_0x150 + (long)p_Var1),
               *(int *)(&this->field_0xd8 + (long)p_Var1) *
               *(int *)(&this->field_0xd4 + (long)p_Var1),iVar14,
               *(int *)(&this->field_0xd0 + (long)p_Var1),(Allocator *)0x0);
  this_00 = &this->weight_data_t;
  p_Var1 = this->_vptr_DeformableConv2D_x86_fma[-3];
  uStack_160 = 0x544586;
  Mat::create(this_00,iVar14,
              *(int *)(&this->field_0xd8 + (long)p_Var1) *
              *(int *)(&this->field_0xd4 + (long)p_Var1),*(int *)(&this->field_0xd0 + (long)p_Var1),
              4,(Allocator *)0x0);
  if (this_00->data == (void *)0x0) {
    cVar20 = true;
  }
  else {
    cVar20 = (long)(this->weight_data_t).c * (this->weight_data_t).cstep == 0;
  }
  if ((bool)cVar20 == false) {
    pp_Var2 = this->_vptr_DeformableConv2D_x86_fma;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
      pp_Var3 = this->_vptr_DeformableConv2D_x86_fma;
      local_38 = (this->weight_data_t).data;
      sVar4 = (this->weight_data_t).cstep;
      sVar5 = (this->weight_data_t).elemsize;
      lVar17 = 0;
      puVar15 = (undefined4 *)local_98.data;
      do {
        p_Var1 = pp_Var3[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var1) *
                *(int *)(&this->field_0xd4 + (long)p_Var1)) {
          puVar18 = (undefined4 *)(sVar4 * sVar5 * lVar17 + (long)local_38);
          lVar19 = 0;
          puVar13 = puVar15;
          do {
            puVar12 = puVar13;
            uVar16 = uVar10 & 0xffffffff;
            if (0 < iVar14) {
              do {
                *puVar18 = *puVar12;
                puVar18 = puVar18 + 1;
                puVar12 = (undefined4 *)
                          ((long)puVar12 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
            lVar19 = lVar19 + 1;
            p_Var1 = pp_Var3[-3];
            puVar13 = puVar13 + 1;
          } while (lVar19 < (long)*(int *)(&this->field_0xd8 + (long)p_Var1) *
                            (long)*(int *)(&this->field_0xd4 + (long)p_Var1));
        }
        lVar17 = lVar17 + 1;
        puVar15 = (undefined4 *)
                  ((long)puVar15 +
                  CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep);
      } while (lVar17 < *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
    piVar6 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    local_149 = cVar20;
    local_48 = this_00;
    local_40 = opt;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            uStack_160 = 0x5446f3;
            free(local_98.data);
          }
        }
        else {
          uStack_160 = 0x5446e4;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    p_Var1 = this->_vptr_DeformableConv2D_x86_fma[-3];
    uStack_160 = 0x54475f;
    Mat::reshape(&local_128,this_00,
                 iVar14 * *(int *)(&this->field_0xd4 + (long)p_Var1) *
                 *(int *)(&this->field_0xd8 + (long)p_Var1),
                 *(int *)(&this->field_0xd0 + (long)p_Var1),(Allocator *)0x0);
    if (this_00 != &local_128) {
      piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_t).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar7 = (this->weight_data_t).data;
          pAVar8 = (this->weight_data_t).allocator;
          if (pAVar8 == (Allocator *)0x0) {
            if (pvVar7 != (void *)0x0) {
              uStack_160 = 0x5447a5;
              free(pvVar7);
            }
          }
          else {
            uStack_160 = 0x544796;
            (*pAVar8->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_t).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_t).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_t).elemsize + 4) = 0;
      this_00->data = (void *)0x0;
      (this->weight_data_t).refcount = (int *)0x0;
      (this->weight_data_t).dims = 0;
      (this->weight_data_t).w = 0;
      (this->weight_data_t).h = 0;
      (this->weight_data_t).d = 0;
      (this->weight_data_t).c = 0;
      (this->weight_data_t).data = local_128.data;
      (this->weight_data_t).refcount =
           (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      (this->weight_data_t).elempack = local_128.elempack;
      (this->weight_data_t).allocator = local_128.allocator;
      (this->weight_data_t).dims = local_128.dims;
      (this->weight_data_t).w = local_128.w;
      (this->weight_data_t).h = local_128.h;
      (this->weight_data_t).d = local_128.d;
      (this->weight_data_t).c = local_128.c;
      (this->weight_data_t).cstep = local_128.cstep;
    }
    piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            uStack_160 = 0x544840;
            free(local_128.data);
          }
        }
        else {
          uStack_160 = 0x544831;
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uStack_160 = 0x54484a;
    pLVar11 = create_layer(0xf);
    this->inner_product = pLVar11;
    uStack_160 = 0x544858;
    ParamDict::ParamDict(&local_138);
    uStack_160 = 0x544873;
    ParamDict::set(&local_138,0,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_fma[-3]));
    uStack_160 = 0x544891;
    ParamDict::set(&local_138,1,
                   *(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_fma[-3]));
    uStack_160 = 0x5448af;
    ParamDict::set(&local_138,2,
                   *(int *)(&this->field_0x100 + (long)this->_vptr_DeformableConv2D_x86_fma[-3]));
    uStack_160 = 0x5448cd;
    ParamDict::set(&local_138,9,
                   *(int *)(&this->field_0x104 + (long)this->_vptr_DeformableConv2D_x86_fma[-3]));
    uStack_160 = 0x5448ee;
    ParamDict::set(&local_138,10,
                   (Mat *)(&this->field_0x108 + (long)this->_vptr_DeformableConv2D_x86_fma[-3]));
    uStack_160 = 0x5448fd;
    (*this->inner_product->_vptr_Layer[2])(this->inner_product,&local_138);
    lVar17 = 0x40;
    do {
      *(undefined8 *)((long)&local_128.data + lVar17) = 0;
      *(undefined8 *)((long)&uStack_168 + lVar17) = 0;
      *(undefined8 *)((long)&stack0xfffffffffffffea0 + lVar17) = 0;
      *(undefined8 *)((long)((long)register0x00000020 + -0x15c) + lVar17) = 0;
      *(undefined8 *)((long)((long)register0x00000020 + -0x15c) + lVar17 + 8) = 0;
      *(undefined8 *)(local_148 + lVar17) = 0;
      *(undefined8 *)(local_148 + lVar17 + 8) = 0;
      *(undefined8 *)(local_148 + lVar17 + 0xc) = 0;
      *(undefined8 *)((long)&local_138._vptr_ParamDict + lVar17 + 4) = 0;
      lVar17 = lVar17 + 0x48;
    } while (lVar17 != 0xd0);
    if (&local_128 != this_00) {
      piVar6 = (this->weight_data_t).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              uStack_160 = 0x54497b;
              free(local_128.data);
            }
          }
          else {
            uStack_160 = 0x54496c;
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_128.data = (this->weight_data_t).data;
      piVar6 = (this->weight_data_t).refcount;
      local_128.refcount._0_4_ = SUB84(piVar6,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)piVar6 >> 0x20);
      sVar4 = (this->weight_data_t).elemsize;
      local_128.elemsize._0_4_ = (undefined4)sVar4;
      local_128.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
      local_128.elempack = (this->weight_data_t).elempack;
      local_128.allocator = (this->weight_data_t).allocator;
      local_128.dims = (this->weight_data_t).dims;
      local_128.w = (this->weight_data_t).w;
      local_128.h = (this->weight_data_t).h;
      local_128.d = (this->weight_data_t).d;
      local_128.c = (this->weight_data_t).c;
      local_128.cstep = (this->weight_data_t).cstep;
    }
    p_Var1 = this->_vptr_DeformableConv2D_x86_fma[-3];
    if (*(int *)(&this->field_0xfc + (long)p_Var1) != 0) {
      if (&local_e0 != (void **)(&this->field_0x198 + (long)p_Var1)) {
        piVar6 = *(int **)(&this->field_0x1a0 + (long)p_Var1);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(uStack_d4,uStack_d8);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c0 == (long *)0x0) {
              if (local_e0 != (void *)0x0) {
                uStack_160 = 0x544a5b;
                free(local_e0);
              }
            }
            else {
              uStack_160 = 0x544a4c;
              (**(code **)(*local_c0 + 0x18))();
            }
          }
        }
        local_e0 = *(void **)(&this->field_0x198 + (long)p_Var1);
        uStack_d8 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var1);
        uStack_d4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var1) >> 0x20);
        uStack_d0 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var1);
        uStack_cc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var1) >> 0x20);
        uStack_c8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var1);
        local_c0 = *(long **)(&this->field_0x1b8 + (long)p_Var1);
        local_b8 = *(undefined8 *)(&this->field_0x1c0 + (long)p_Var1);
        uStack_b0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var1);
        local_a8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var1);
        local_a0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var1);
      }
    }
    pLVar11 = this->inner_product;
    uStack_160 = 0x544b09;
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_148,&local_128);
    uStack_160 = 0x544b17;
    (*pLVar11->_vptr_Layer[3])(pLVar11,local_148);
    uStack_160 = 0x544b21;
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_148);
    uStack_160 = 0x544b2e;
    (*this->inner_product->_vptr_Layer[4])();
    uStack_160 = 0x544b38;
    pLVar11 = create_layer(0x2f);
    this->permute = pLVar11;
    uStack_160 = 0x544b46;
    ParamDict::ParamDict((ParamDict *)local_148);
    uStack_160 = 0x544b57;
    ParamDict::set((ParamDict *)local_148,0,1);
    cVar20 = local_149;
    uStack_160 = 0x544b6b;
    (*this->permute->_vptr_Layer[2])(this->permute,local_148);
    uStack_160 = 0x544b78;
    (*this->permute->_vptr_Layer[4])(this->permute,opt);
    uStack_160 = 0x544b82;
    ParamDict::~ParamDict((ParamDict *)local_148);
    lVar17 = 0x48;
    do {
      piVar6 = *(int **)((long)&local_128.refcount + lVar17);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar7 = *(void **)((long)&local_128.data + lVar17);
          plVar9 = *(long **)((long)&local_128.allocator + lVar17);
          if (plVar9 == (long *)0x0) {
            if (pvVar7 != (void *)0x0) {
              uStack_160 = 0x544bc2;
              free(pvVar7);
            }
          }
          else {
            uStack_160 = 0x544baf;
            (**(code **)(*plVar9 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_128.cstep + lVar17) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_128.elemsize + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_128.data + lVar17) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar17) = 0;
      *(undefined8 *)((long)&local_128.dims + lVar17) = 0;
      *(undefined8 *)((long)&local_128.h + lVar17) = 0;
      *(undefined4 *)((long)&local_128.c + lVar17) = 0;
      lVar17 = lVar17 + -0x48;
    } while (lVar17 != -0x48);
    uStack_160 = 0x544bff;
    ParamDict::~ParamDict(&local_138);
  }
  piVar6 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
          uStack_160 = 0x544c3b;
          free(local_98.data);
        }
      }
      else {
        uStack_160 = 0x544c2c;
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar14 = -100;
  if (cVar20 == '\0') {
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int DeformableConv2D_x86_fma::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}